

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardware.cpp
# Opt level: O1

void I_ClosestResolution(int *width,int *height,int bits)

{
  IVideo *pIVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  int theight;
  int twidth;
  int local_4c;
  int local_48;
  uint local_44;
  ulong local_40;
  uint local_34;
  
  local_40 = 0;
  local_4c = 0;
  iVar4 = 0;
  local_34 = bits;
  do {
    pIVar1 = Video;
    bVar2 = fullscreen.Value;
    if (screen != (DFrameBuffer *)0x0) {
      iVar3 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x21])();
      bVar2 = (byte)iVar3;
    }
    (*pIVar1->_vptr_IVideo[5])(pIVar1,(ulong)local_34,(ulong)bVar2);
    iVar3 = (*Video->_vptr_IVideo[6])(Video,&local_44,&local_48,0);
    bVar7 = true;
    if ((char)iVar3 != '\0') {
      uVar6 = 0xffffffff;
      do {
        while( true ) {
          iVar3 = local_44 - *width;
          if ((iVar3 == 0) && (local_48 == *height)) {
            return;
          }
          if ((iVar4 != 0) || ((*width <= (int)local_44 && (*height <= local_48)))) break;
          iVar3 = (*Video->_vptr_IVideo[6])(Video,&local_44,&local_48,0);
          if ((char)iVar3 == '\0') {
            bVar7 = uVar6 == 0xffffffff;
            goto LAB_002c8896;
          }
        }
        uVar5 = (local_48 - *height) * (local_48 - *height) + iVar3 * iVar3;
        bVar7 = uVar5 < uVar6;
        if (bVar7) {
          uVar6 = uVar5;
          local_4c = local_48;
        }
        local_40 = local_40 & 0xffffffff;
        if (bVar7) {
          local_40 = (ulong)local_44;
        }
        bVar7 = false;
        iVar3 = (*Video->_vptr_IVideo[6])(Video,&local_44,&local_48,0);
      } while ((char)iVar3 != '\0');
    }
LAB_002c8896:
    if (!bVar7) {
      *width = (int)local_40;
      *height = local_4c;
      return;
    }
    bVar7 = iVar4 != 0;
    iVar4 = iVar4 + 1;
    if (bVar7) {
      return;
    }
  } while( true );
}

Assistant:

void I_ClosestResolution (int *width, int *height, int bits)
{
	int twidth, theight;
	int cwidth = 0, cheight = 0;
	int iteration;
	DWORD closest = 4294967295u;

	for (iteration = 0; iteration < 2; iteration++)
	{
		Video->StartModeIterator (bits, screen ? screen->IsFullscreen() : fullscreen);
		while (Video->NextMode (&twidth, &theight, NULL))
		{
			if (twidth == *width && theight == *height)
				return;

			if (iteration == 0 && (twidth < *width || theight < *height))
				continue;

			DWORD dist = (twidth - *width) * (twidth - *width)
				+ (theight - *height) * (theight - *height);

			if (dist < closest)
			{
				closest = dist;
				cwidth = twidth;
				cheight = theight;
			}
		}
		if (closest != 4294967295u)
		{
			*width = cwidth;
			*height = cheight;
			return;
		}
	}
}